

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

pin_t __thiscall
lsim::Simulator::assign_pin(Simulator *this,SimComponent *component,bool used_as_input)

{
  size_type sVar1;
  reference pvVar2;
  value_type local_28;
  node_t local_24;
  pin_t local_20;
  node_t node_id;
  pin_t result;
  bool used_as_input_local;
  SimComponent *component_local;
  Simulator *this_local;
  
  node_id._3_1_ = used_as_input;
  _result = component;
  component_local = (SimComponent *)this;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_pin_nodes);
  local_20 = (pin_t)sVar1;
  local_24 = assign_node(this,_result,(bool)(node_id._3_1_ & 1));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_pin_nodes,&local_24);
  local_28 = VALUE_UNDEFINED;
  std::vector<lsim::Value,_std::allocator<lsim::Value>_>::push_back(&this->m_pin_values,&local_28);
  pvVar2 = std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::operator[]
                     (&this->m_node_metadata,(ulong)local_24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pvVar2->m_pins,&local_20);
  return local_20;
}

Assistant:

pin_t Simulator::assign_pin(SimComponent *component, bool used_as_input) {
    auto result = static_cast<pin_t>(m_pin_nodes.size());
	auto node_id = assign_node(component, used_as_input);
	m_pin_nodes.push_back(node_id);
    m_pin_values.push_back(VALUE_UNDEFINED);
	m_node_metadata[node_id].m_pins.push_back(result);
    return result;
}